

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.h
# Opt level: O2

void __thiscall OutputContext::Print(OutputContext *this,char *format,__va_list_tag *args)

{
  byte *pbVar1;
  char cVar2;
  uint uVar3;
  long lVar4;
  char cVar5;
  int iVar6;
  undefined8 *puVar7;
  uint *puVar8;
  byte *pbVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  byte *pbVar13;
  char *pcVar14;
  long lVar15;
  char reverse [16];
  char forward [16];
  
LAB_0010fc09:
  do {
    for (lVar15 = 0; (cVar2 = format[lVar15], cVar2 != '\0' && (cVar2 != '%')); lVar15 = lVar15 + 1)
    {
    }
    if (lVar15 != 0) {
      Print(this,format,(uint)lVar15);
      cVar2 = format[lVar15];
    }
    if (cVar2 != '%') {
      if (cVar2 != '\0') {
LAB_0010fe8b:
        iVar6 = vsnprintf(this->tempBuf,(ulong)(this->tempBufSize - 1),format + lVar15,args);
        if ((iVar6 < 0) || ((int)this->tempBufSize <= iVar6)) {
          (*this->writeStream)(this->stream,this->outputBuf,this->outputBufPos);
          this->outputBufPos = 0;
          (*this->writeStream)(this->stream,this->tempBuf,this->tempBufSize - 1);
          __assert_fail("!\"temporary buffer is too small\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Output.h"
                        ,0xe4,"void OutputContext::Print(const char *, __va_list_tag *)");
        }
        Print(this,this->tempBuf);
      }
      return;
    }
    cVar2 = format[lVar15 + 1];
    if (cVar2 != '%') {
      if (cVar2 == '.') {
        if ((format[lVar15 + 2] == '*') && (format[lVar15 + 3] == 's')) {
          uVar12 = args->gp_offset;
          uVar11 = (ulong)uVar12;
          if (uVar11 < 0x29) {
            args->gp_offset = (uint)(uVar11 + 8);
            uVar10 = *(uint *)((long)args->reg_save_area + uVar11);
            if (0x20 < uVar12) goto LAB_0010fe61;
            puVar7 = (undefined8 *)(uVar11 + 8 + (long)args->reg_save_area);
            args->gp_offset = uVar12 + 0x10;
          }
          else {
            puVar8 = (uint *)args->overflow_arg_area;
            args->overflow_arg_area = puVar8 + 2;
            uVar10 = *puVar8;
LAB_0010fe61:
            puVar7 = (undefined8 *)args->overflow_arg_area;
            args->overflow_arg_area = puVar7 + 1;
          }
          Print(this,(char *)*puVar7,uVar10);
          format = format + lVar15 + 4;
          goto LAB_0010fc09;
        }
      }
      else if (cVar2 == 's') {
        uVar12 = args->gp_offset;
        if ((ulong)uVar12 < 0x29) {
          puVar7 = (undefined8 *)((ulong)uVar12 + (long)args->reg_save_area);
          args->gp_offset = uVar12 + 8;
        }
        else {
          puVar7 = (undefined8 *)args->overflow_arg_area;
          args->overflow_arg_area = puVar7 + 1;
        }
        Print(this,(char *)*puVar7);
        format = format + lVar15 + 2;
        goto LAB_0010fc09;
      }
      lVar4 = lVar15 + 2;
      if (cVar2 != '0') {
        lVar4 = lVar15 + 1;
      }
      uVar12 = (int)format[lVar4] - 0x30;
      pcVar14 = format + lVar4 + (uVar12 < 10);
      if ((*pcVar14 != 'x') && (*pcVar14 != 'd')) goto LAB_0010fe8b;
      uVar10 = args->gp_offset;
      if ((ulong)uVar10 < 0x29) {
        puVar8 = (uint *)((ulong)uVar10 + (long)args->reg_save_area);
        args->gp_offset = uVar10 + 8;
      }
      else {
        puVar8 = (uint *)args->overflow_arg_area;
        args->overflow_arg_area = puVar8 + 2;
      }
      uVar10 = *puVar8;
      cVar5 = *pcVar14;
      if ((cVar5 == 'd') && ((int)uVar10 < 0)) {
        Print(this,'-');
        cVar5 = *pcVar14;
      }
      if (cVar5 == 'd') {
        uVar3 = -uVar10;
        if (0 < (int)uVar10) {
          uVar3 = uVar10;
        }
        uVar11 = (ulong)uVar3;
        reverse[0] = (byte)(uVar11 % 10) | 0x30;
        pbVar13 = (byte *)reverse;
        while (pbVar13 = pbVar13 + 1, 9 < (uint)uVar11) {
          uVar11 = uVar11 / 10;
          *pbVar13 = (byte)(uVar11 % 10) | 0x30;
        }
      }
      else {
        reverse[0] = "0123456789abcdef"[uVar10 & 0xf];
        pbVar13 = (byte *)reverse;
        while (pbVar13 = pbVar13 + 1, 0xf < uVar10) {
          uVar10 = uVar10 >> 4;
          *pbVar13 = "0123456789abcdef"[uVar10 & 0xf];
        }
      }
      for (uVar10 = (int)pbVar13 - (int)reverse; (uVar12 < 10 && (uVar10 < uVar12));
          uVar10 = uVar10 + 1) {
        *pbVar13 = (cVar2 == '0') << 4 | 0x20;
        pbVar13 = pbVar13 + 1;
      }
      pbVar9 = (byte *)forward;
      do {
        pbVar1 = pbVar13 + -1;
        pbVar13 = pbVar13 + -1;
        *pbVar9 = *pbVar1;
        pbVar9 = pbVar9 + 1;
      } while (pbVar13 != (byte *)reverse);
      *pbVar9 = 0;
      Print(this,forward);
      format = pcVar14 + 1;
      goto LAB_0010fc09;
    }
    Print(this,'%');
    format = format + lVar15 + 2;
  } while( true );
}

Assistant:

void Print(const char *format, va_list args)
	{
		const char *pos = format;

		for(;;)
		{
			const char *start = pos;

			while(*pos && *pos != '%')
				pos++;

			if(pos != start)
				Print(start, unsigned(pos - start));

			if(pos[0] == '%' && pos[1] == 's')
			{
				pos += 2;

				char *str = va_arg(args, char*);

				Print(str);
			}
			else if(pos[0] == '%' && pos[1] == '.' && pos[2] == '*' && pos[3] == 's')
			{
				pos += 4;

				unsigned length = va_arg(args, unsigned);
				char *str = va_arg(args, char*);

				Print(str, length);
			}
			else if(pos[0] == '%' && pos[1] == '%')
			{
				pos += 2;

				Print('%');
			}
			else if(pos[0] == '%')
			{
				const char *tmpPos = pos + 1;

				bool leadingZeroes = false;

				if(*tmpPos == '0')
				{
					leadingZeroes = true;

					tmpPos++;
				}

				unsigned width = 0;

				if(unsigned(*tmpPos - '0') < 10)
				{
					width = unsigned(*tmpPos - '0');

					tmpPos++;
				}

				if(*tmpPos == 'd' || *tmpPos == 'x')
				{
					pos = tmpPos + 1;

					int value = va_arg(args, int);

					if(*tmpPos == 'd' && value < 0)
						Print('-');

					unsigned uvalue;

					if(*tmpPos == 'd' && value < 0)
						uvalue = -value;
					else
						uvalue = value;

					char reverse[16];

					char *curr = reverse;

					if(*tmpPos == 'd')
					{
						*curr++ = (char)((uvalue % 10) + '0');

						while(uvalue /= 10)
							*curr++ = (char)((uvalue % 10) + '0');
					}
					else
					{
						const char *symbols = "0123456789abcdef";

						*curr++ = symbols[uvalue % 16];

						while(uvalue /= 16)
							*curr++ = symbols[uvalue % 16];
					}

					while(unsigned(curr - reverse) < width)
						*curr++ = leadingZeroes ? '0' : ' ';

					char forward[16];

					char *result = forward;

					do
					{
						--curr;
						*result++ = *curr;
					}
					while(curr != reverse);

					*result = 0;

					Print(forward);
				}
				else
				{
					break;
				}
			}
			else if(pos[0] == 0)
			{
				return;
			}
			else
			{
				break;
			}
		}

		int length = vsnprintf(tempBuf, tempBufSize - 1, pos, args);

		if(length < 0 || length > int(tempBufSize) - 1)
		{
			writeStream(stream, outputBuf, outputBufPos);
			outputBufPos = 0;

			writeStream(stream, tempBuf, tempBufSize - 1);

			assert(!"temporary buffer is too small");
		}
		else
		{
			Print(tempBuf);
		}
	}